

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_cwksp.h
# Opt level: O0

void ZSTD_cwksp_clean_tables(ZSTD_cwksp *ws)

{
  ZSTD_cwksp *ws_local;
  
  if (ws->tableValidEnd < ws->tableEnd) {
    memset(ws->tableValidEnd,0,(long)ws->tableEnd - (long)ws->tableValidEnd);
  }
  ZSTD_cwksp_mark_tables_clean(ws);
  return;
}

Assistant:

MEM_STATIC void ZSTD_cwksp_clean_tables(ZSTD_cwksp* ws) {
    DEBUGLOG(4, "cwksp: ZSTD_cwksp_clean_tables");
    assert(ws->tableValidEnd >= ws->objectEnd);
    assert(ws->tableValidEnd <= ws->allocStart);
    if (ws->tableValidEnd < ws->tableEnd) {
        ZSTD_memset(ws->tableValidEnd, 0, (BYTE*)ws->tableEnd - (BYTE*)ws->tableValidEnd);
    }
    ZSTD_cwksp_mark_tables_clean(ws);
}